

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

SymOpnd * __thiscall
IRBuilder::BuildFieldOpnd
          (IRBuilder *this,OpCode newOpcode,RegSlot reg,PropertyId propertyId,
          PropertyIdIndexType propertyIdIndex,PropertyKind propertyKind,uint inlineCacheIndex)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  JITTimeFunctionBody *this_00;
  undefined4 *puVar4;
  PropertySym *propertySym_00;
  PropertySymOpnd *local_38;
  SymOpnd *symOpnd;
  PropertySym *propertySym;
  PropertyKind propertyKind_local;
  PropertyIdIndexType propertyIdIndex_local;
  PropertyId propertyId_local;
  RegSlot reg_local;
  OpCode newOpcode_local;
  IRBuilder *this_local;
  
  this_00 = Func::GetJITFunctionBody(this->m_func);
  uVar3 = JITTimeFunctionBody::GetInlineCacheCount(this_00);
  if ((uVar3 <= inlineCacheIndex) && (inlineCacheIndex != 0xffffffff)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x491,
                       "(inlineCacheIndex < m_func->GetJITFunctionBody()->GetInlineCacheCount() || inlineCacheIndex == Js::Constants::NoInlineCacheIndex)"
                       ,
                       "inlineCacheIndex < m_func->GetJITFunctionBody()->GetInlineCacheCount() || inlineCacheIndex == Js::Constants::NoInlineCacheIndex"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  propertySym_00 = BuildFieldSym(this,reg,propertyId,propertyIdIndex,inlineCacheIndex,propertyKind);
  bVar2 = OpCodeAttr::FastFldInstr(newOpcode);
  if ((bVar2) || (inlineCacheIndex != 0xffffffff)) {
    if (propertyKind != PropertyKindData) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                         ,0x499,"(propertyKind == PropertyKindData)",
                         "propertyKind == PropertyKindData");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    local_38 = IR::PropertySymOpnd::New(propertySym_00,inlineCacheIndex,TyVar,this->m_func);
    if (((inlineCacheIndex != 0xffffffff) && (propertySym_00->m_loadInlineCacheIndex == 0xffffffff))
       && (bVar2 = GlobOpt::IsPREInstrCandidateLoad(newOpcode), bVar2)) {
      propertySym_00->m_loadInlineCacheIndex = inlineCacheIndex;
      propertySym_00->m_loadInlineCacheFunc = this->m_func;
    }
  }
  else {
    local_38 = (PropertySymOpnd *)IR::SymOpnd::New(&propertySym_00->super_Sym,TyVar,this->m_func);
  }
  return &local_38->super_SymOpnd;
}

Assistant:

IR::SymOpnd *
IRBuilder::BuildFieldOpnd(Js::OpCode newOpcode, Js::RegSlot reg, Js::PropertyId propertyId, Js::PropertyIdIndexType propertyIdIndex, PropertyKind propertyKind, uint inlineCacheIndex)
{
    AssertOrFailFast(inlineCacheIndex < m_func->GetJITFunctionBody()->GetInlineCacheCount() || inlineCacheIndex == Js::Constants::NoInlineCacheIndex);
    PropertySym * propertySym = BuildFieldSym(reg, propertyId, propertyIdIndex, inlineCacheIndex, propertyKind);
    IR::SymOpnd * symOpnd;

    // If we plan to apply object type optimization to this instruction or if we intend to emit a fast path using an inline
    // cache, we will need a property sym operand.
    if (OpCodeAttr::FastFldInstr(newOpcode) || inlineCacheIndex != (uint)-1)
    {
        Assert(propertyKind == PropertyKindData);
        symOpnd = IR::PropertySymOpnd::New(propertySym, inlineCacheIndex, TyVar, this->m_func);

        if (inlineCacheIndex != (uint)-1 && propertySym->m_loadInlineCacheIndex == (uint)-1)
        {
            if (GlobOpt::IsPREInstrCandidateLoad(newOpcode))
            {
                propertySym->m_loadInlineCacheIndex = inlineCacheIndex;
                propertySym->m_loadInlineCacheFunc = this->m_func;
            }
        }
    }
    else
    {
        symOpnd = IR::SymOpnd::New(propertySym, TyVar, this->m_func);
    }

    return symOpnd;
}